

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void __thiscall CVmObjGramProd::mark_alt_refs(CVmObjGramProd *this,vmgram_alt_info *alt,uint state)

{
  ulong uVar1;
  anon_union_24_5_d4664839_for_typinfo *paVar2;
  ulong uVar3;
  
  if (alt->proc_obj != 0) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,alt->proc_obj,state);
  }
  uVar1 = alt->tok_cnt;
  if (uVar1 != 0) {
    paVar2 = &alt->toks->typinfo;
    uVar3 = 0;
    do {
      if ((*(uchar *)((long)paVar2 + -6) == '\x01') && (paVar2->prod_obj != 0)) {
        CVmObjTable::add_to_gc_queue(&G_obj_table_X,paVar2->prod_obj,state);
        uVar1 = alt->tok_cnt;
      }
      uVar3 = uVar3 + 1;
      paVar2 = (anon_union_24_5_d4664839_for_typinfo *)((long)paVar2 + 0x20);
    } while (uVar3 < uVar1);
  }
  return;
}

Assistant:

void CVmObjGramProd::mark_alt_refs(VMG_ const vmgram_alt_info *alt, uint state)
{
    /* mark the match object */
    if (alt->proc_obj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(alt->proc_obj, state);

    /* run through the token list */
    vmgram_tok_info *tok = alt->toks;
    for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
    {
        /* only production matches have object references */
        if (tok->typ == VMGRAM_MATCH_PROD
            && tok->typinfo.prod_obj != VM_INVALID_OBJ)
        {
            /* mark the reference */
            G_obj_table->mark_all_refs(tok->typinfo.prod_obj, state);
        }
    }
}